

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall
icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,UnicodeString *num,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  int32_t iVar3;
  double n_00;
  StringPiece SVar4;
  StringPiece n_01;
  int32_t v;
  double n;
  int32_t decimalPoint;
  undefined1 local_c0 [8];
  DecimalQuantity dl;
  undefined1 local_60 [8];
  CharString cs;
  UErrorCode *status_local;
  UnicodeString *num_local;
  FixedDecimal *this_local;
  
  cs._56_8_ = status;
  IFixedDecimal::IFixedDecimal(&this->super_IFixedDecimal);
  UObject::UObject(&this->super_UObject);
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_004ff660;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_004ff6a0;
  CharString::CharString((CharString *)local_60);
  CharString::appendInvariantChars((CharString *)local_60,num,(UErrorCode *)cs._56_8_);
  icu_63::number::impl::DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_c0);
  SVar4 = CharString::toStringPiece((CharString *)local_60);
  n_01._12_4_ = 0;
  n_01.ptr_ = (char *)SUB128(SVar4._0_12_,0);
  n_01.length_ = SUB124(SVar4._0_12_,8);
  icu_63::number::impl::DecimalQuantity::setToDecNumber
            ((DecimalQuantity *)local_c0,n_01,(UErrorCode *)cs._56_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)cs._56_8_);
  if (UVar1 == '\0') {
    uVar2 = UnicodeString::indexOf(num,L'.');
    n_00 = icu_63::number::impl::DecimalQuantity::toDouble((DecimalQuantity *)local_c0);
    if (uVar2 == 0xffffffff) {
      init(this,(EVP_PKEY_CTX *)0x0);
    }
    else {
      iVar3 = UnicodeString::length(num);
      getFractionalDigits(n_00,~uVar2 + iVar3);
      init(this,(EVP_PKEY_CTX *)(ulong)(~uVar2 + iVar3));
    }
  }
  else {
    init(this,(EVP_PKEY_CTX *)0x0);
  }
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_c0);
  CharString::~CharString((CharString *)local_60);
  return;
}

Assistant:

FixedDecimal::FixedDecimal(const UnicodeString &num, UErrorCode &status) {
    CharString cs;
    cs.appendInvariantChars(num, status);
    DecimalQuantity dl;
    dl.setToDecNumber(cs.toStringPiece(), status);
    if (U_FAILURE(status)) {
        init(0, 0, 0);
        return;
    }
    int32_t decimalPoint = num.indexOf(DOT);
    double n = dl.toDouble();
    if (decimalPoint == -1) {
        init(n, 0, 0);
    } else {
        int32_t v = num.length() - decimalPoint - 1;
        init(n, v, getFractionalDigits(n, v));
    }
}